

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ver;
  char buf [64];
  string local_a8;
  string local_88;
  char local_68 [72];
  
  pcVar2 = (this->Name)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  if ((this->VersionFound)._M_string_length == 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_88);
  }
  else {
    cmMakefile::AddDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_88,
               (this->VersionFound)._M_dataplus._M_p);
  }
  sprintf(local_68,"%u",(ulong)this->VersionFoundMajor);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  cmMakefile::AddDefinition(pcVar3,&local_a8,local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_68,"%u",(ulong)this->VersionFoundMinor);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  cmMakefile::AddDefinition(pcVar3,&local_a8,local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_68,"%u",(ulong)this->VersionFoundPatch);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  cmMakefile::AddDefinition(pcVar3,&local_a8,local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_68,"%u",(ulong)this->VersionFoundTweak);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  cmMakefile::AddDefinition(pcVar3,&local_a8,local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_68,"%u",(ulong)this->VersionFoundCount);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  cmMakefile::AddDefinition(pcVar3,&local_a8,local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string ver = this->Name;
  ver += "_VERSION";
  if(this->VersionFound.empty())
    {
    this->Makefile->RemoveDefinition(ver);
    }
  else
    {
    this->Makefile->AddDefinition(ver, this->VersionFound.c_str());
    }

  // Store the version components.
  char buf[64];
  sprintf(buf, "%u", this->VersionFoundMajor);
  this->Makefile->AddDefinition(ver+"_MAJOR", buf);
  sprintf(buf, "%u", this->VersionFoundMinor);
  this->Makefile->AddDefinition(ver+"_MINOR", buf);
  sprintf(buf, "%u", this->VersionFoundPatch);
  this->Makefile->AddDefinition(ver+"_PATCH", buf);
  sprintf(buf, "%u", this->VersionFoundTweak);
  this->Makefile->AddDefinition(ver+"_TWEAK", buf);
  sprintf(buf, "%u", this->VersionFoundCount);
  this->Makefile->AddDefinition(ver+"_COUNT", buf);
}